

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adversarialunions_benchmark.c
# Opt level: O0

int main(void)

{
  printf("How to best aggregate the bitmaps is data-sensitive.\n");
  quickfull();
  notsofull();
  return 0;
}

Assistant:

int main() {
    printf("How to best aggregate the bitmaps is data-sensitive.\n");
    quickfull();
    notsofull();
    return 0;
}